

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::FReadFunc::checkArguments
          (FReadFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  size_type sVar2;
  reference ppEVar3;
  Expression *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  Compilation *comp;
  Type *pTVar4;
  Type *this_01;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0x973029);
  pTVar4 = (Type *)0x2;
  this_01 = (Type *)0x4;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,SUB81((ulong)in_RCX >> 0x38,0),in_RDI,
                     in_stack_00000000,in_stack_00000020,in_stack_00000028);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9730a8);
    bVar1 = Type::isIntegral(this_01);
    if (!bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9730ce)
      ;
      bVar1 = Type::isUnpackedArray(pTVar4);
      if (!bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
        return pTVar4;
      }
    }
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x97312c);
    bVar1 = Type::isIntegral(this_01);
    if (bVar1) {
      sVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                        ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                         0x97317a);
      if (2 < sVar2) {
        ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (in_RDX,2);
        if ((*ppEVar3)->kind != EmptyArgument) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (in_RDX,2);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x9731b6);
          bVar1 = Type::isIntegral(this_01);
          if (!bVar1) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,2);
            pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
            return pTVar4;
          }
        }
        sVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                          ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                           0x973204);
        if (3 < sVar2) {
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                    (in_RDX,3);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x973225);
          bVar1 = Type::isIntegral(this_01);
          if (!bVar1) {
            std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,3);
            pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
            return pTVar4;
          }
        }
      }
      pTVar4 = Compilation::getIntegerType(this_00);
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      pTVar4 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
    }
  }
  else {
    pTVar4 = Compilation::getErrorType(this_00);
  }
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 4))
            return comp.getErrorType();

        // First argument is integral or an unpacked array.
        if (!args[0]->type->isIntegral() && !args[0]->type->isUnpackedArray())
            return badArg(context, *args[0]);

        // Second argument is an fd (integral).
        if (!args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        if (args.size() > 2) {
            // Third arg can be empty or integral.
            if (args[2]->kind != ExpressionKind::EmptyArgument && !args[2]->type->isIntegral())
                return badArg(context, *args[2]);

            if (args.size() > 3) {
                // Fourth arg must be integral.
                if (!args[3]->type->isIntegral())
                    return badArg(context, *args[3]);
            }
        }

        return comp.getIntegerType();
    }